

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall PrintC::emitEnumDefinition(PrintC *this,TypeEnum *ct)

{
  _Rb_tree_header *p_Var1;
  type_metatype tVar2;
  iterator __position;
  EmitXml *pEVar3;
  pointer puVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  LowlevelError *this_00;
  string local_50;
  
  if ((ct->super_TypeBase).super_Datatype.name._M_string_length == 0) {
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])(this);
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Trying to save unnamed enumeration","");
    LowlevelError::LowlevelError(this_00,&local_50);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  __position._M_current =
       (this->super_PrintLanguage).modstack.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_PrintLanguage).modstack.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,__position,&(this->super_PrintLanguage).mods);
  }
  else {
    *__position._M_current = (this->super_PrintLanguage).mods;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  tVar2 = (ct->super_TypeBase).super_Datatype.metatype;
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar3 = (this->super_PrintLanguage).emit;
  (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,"typedef enum",0);
  pEVar3 = (this->super_PrintLanguage).emit;
  (*pEVar3->_vptr_EmitXml[0x21])(pEVar3,1,0);
  uVar5 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
  pEVar3 = (this->super_PrintLanguage).emit;
  (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,"{",8);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  p_Var6 = (ct->namemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(ct->namemap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    while( true ) {
      pEVar3 = (this->super_PrintLanguage).emit;
      (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,p_Var6[1]._M_parent,5);
      pEVar3 = (this->super_PrintLanguage).emit;
      (*pEVar3->_vptr_EmitXml[0x21])(pEVar3,1,0);
      pEVar3 = (this->super_PrintLanguage).emit;
      (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,"=",8);
      pEVar3 = (this->super_PrintLanguage).emit;
      (*pEVar3->_vptr_EmitXml[0x21])(pEVar3,1,0);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])
                (this,*(undefined8 *)(p_Var6 + 1),
                 (ulong)(uint)(ct->super_TypeBase).super_Datatype.size,(ulong)(tVar2 == TYPE_INT),0,
                 0);
      PrintLanguage::recurse(&this->super_PrintLanguage);
      pEVar3 = (this->super_PrintLanguage).emit;
      (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,";",8);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      if ((_Rb_tree_header *)p_Var6 == p_Var1) break;
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    }
  }
  puVar4 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar3 = (this->super_PrintLanguage).emit;
  (this->super_PrintLanguage).mods = puVar4[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar4 + -1;
  (*pEVar3->_vptr_EmitXml[0x23])(pEVar3,(ulong)uVar5);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar3 = (this->super_PrintLanguage).emit;
  (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,"}",8);
  pEVar3 = (this->super_PrintLanguage).emit;
  (*pEVar3->_vptr_EmitXml[0x21])(pEVar3,1,0);
  pEVar3 = (this->super_PrintLanguage).emit;
  (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,(ct->super_TypeBase).super_Datatype.name._M_dataplus._M_p,8)
  ;
  pEVar3 = (this->super_PrintLanguage).emit;
  (*pEVar3->_vptr_EmitXml[0x19])(pEVar3,";",8);
  return;
}

Assistant:

void PrintC::emitEnumDefinition(const TypeEnum *ct)

{
  map<uintb,string>::const_iterator iter;

  if (ct->getName().size()==0) {
    clear();
    throw LowlevelError("Trying to save unnamed enumeration");
  }

  pushMod();
  bool sign = (ct->getMetatype() == TYPE_INT);
  emit->tagLine();
  emit->print("typedef enum",EmitXml::keyword_color);
  emit->spaces(1);
  int4 id = emit->startIndent();
  emit->print("{");
  emit->tagLine();
  iter = ct->beginEnum();
  while(iter!=ct->endEnum()) {
    emit->print((*iter).second.c_str(),EmitXml::const_color);
    emit->spaces(1);
    emit->print("=",EmitXml::no_color);
    emit->spaces(1);
    push_integer((*iter).first,ct->getSize(),sign,(Varnode *)0,
		 (PcodeOp *)0);
    recurse();
    emit->print(";");
    ++iter;
    if (iter != ct->endEnum())
      emit->tagLine();
  }
  popMod();
  emit->stopIndent(id);
  emit->tagLine();
  emit->print("}");
  emit->spaces(1);
  emit->print(ct->getName().c_str());
  emit->print(";");
}